

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# standard_buffer_manager.cpp
# Opt level: O1

shared_ptr<duckdb::BlockHandle,_true> __thiscall
duckdb::StandardBufferManager::RegisterTransientMemory
          (StandardBufferManager *this,idx_t size,BlockManager *block_manager)

{
  idx_t iVar1;
  idx_t iVar2;
  BlockManager *in_RCX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  shared_ptr<duckdb::BlockHandle,_true> sVar4;
  BufferHandle buffer_handle;
  BufferHandle local_40;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  
  iVar1 = optional_idx::GetIndex(&in_RCX->block_alloc_size);
  iVar2 = optional_idx::GetIndex(&in_RCX->block_header_size);
  if (block_manager < (BlockManager *)(iVar1 - iVar2)) {
    sVar4 = RegisterSmallMemory(this,(MemoryTag)size,9);
    _Var3._M_pi = sVar4.internal.super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi;
  }
  else {
    Allocate(&local_40,(StandardBufferManager *)size,IN_MEMORY_TABLE,in_RCX,false);
    (this->super_BufferManager)._vptr_BufferManager =
         (_func_int **)
         local_40.handle.internal.
         super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    this->db = (DatabaseInstance *)
               local_40.handle.internal.
               super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
    ;
    if ((DatabaseInstance *)
        local_40.handle.internal.super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (DatabaseInstance *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(int *)&((__weak_count<(__gnu_cxx::_Lock_policy)2> *)
                 &(local_40.handle.internal.
                   super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi)->_M_use_count)->_M_pi =
             *(int *)&((__weak_count<(__gnu_cxx::_Lock_policy)2> *)
                      &(local_40.handle.internal.
                        super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi)->_M_use_count)->_M_pi + 1;
        UNLOCK();
      }
      else {
        *(int *)&((__weak_count<(__gnu_cxx::_Lock_policy)2> *)
                 &(local_40.handle.internal.
                   super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi)->_M_use_count)->_M_pi =
             *(int *)&((__weak_count<(__gnu_cxx::_Lock_policy)2> *)
                      &(local_40.handle.internal.
                        super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi)->_M_use_count)->_M_pi + 1;
      }
    }
    BufferHandle::~BufferHandle(&local_40);
    _Var3._M_pi = extraout_RDX;
  }
  sVar4.internal.super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Var3._M_pi;
  sVar4.internal.super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<duckdb::BlockHandle,_true>)
         sVar4.internal.super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

shared_ptr<BlockHandle> StandardBufferManager::RegisterTransientMemory(const idx_t size, BlockManager &block_manager) {
	D_ASSERT(size <= block_manager.GetBlockSize());

	// This comparison is the reason behind passing block_size through transient memory creation.
	// Otherwise, any non-default block size would register as small memory, causing problems when
	// trying to convert that memory to consistent blocks later on.
	if (size < block_manager.GetBlockSize()) {
		return RegisterSmallMemory(MemoryTag::IN_MEMORY_TABLE, size);
	}

	auto buffer_handle = Allocate(MemoryTag::IN_MEMORY_TABLE, &block_manager, false);
	return buffer_handle.GetBlockHandle();
}